

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> __thiscall
kj::anon_unknown_30::SocketAddress::lookupHost
          (SocketAddress *this,LowLevelAsyncIoProvider *lowLevel,String *host,String *service,
          uint portHint,NetworkFilter *filter)

{
  PromiseNode *pPVar1;
  LookupReader *pLVar2;
  _func_int **pp_Var3;
  Disposer *pDVar4;
  uchar auVar5 [8];
  AsyncInputStream *pAVar6;
  int iVar7;
  Thread *this_00;
  Disposer *pDVar8;
  AttachmentPromiseNodeBase *this_01;
  undefined8 *__nbytes;
  void *__buf;
  PromiseNode *extraout_RDX;
  LookupReader *ptrCopy;
  Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> PVar9;
  Thread *ptrCopy_1;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>_>_>
  local_f0;
  int fds [2];
  Own<kj::AsyncInputStream> input;
  undefined1 local_a8 [24];
  AsyncInputStream *pAStack_90;
  LookupReader *local_88;
  undefined1 local_80 [24];
  Fault f;
  LookupParams local_60;
  
  do {
    iVar7 = ::pipe2(fds,0x80800);
    if (-1 < iVar7) goto LAB_002f1523;
    iVar7 = _::Debug::getOsErrorNumber(false);
  } while (iVar7 == -1);
  if (iVar7 != 0) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x375,iVar7,"pipe2(fds, O_NONBLOCK | O_CLOEXEC)","");
    _::Debug::Fault::fatal(&f);
  }
LAB_002f1523:
  (**lowLevel->_vptr_LowLevelAsyncIoProvider)(&input,lowLevel,(ulong)(uint)fds[0],7);
  pPVar1 = (PromiseNode *)(host->content).ptr;
  pDVar8 = (Disposer *)(host->content).size_;
  pLVar2 = (LookupReader *)(host->content).disposer;
  (host->content).ptr = (char *)0x0;
  (host->content).size_ = 0;
  pp_Var3 = (_func_int **)(service->content).ptr;
  pDVar4 = (Disposer *)(service->content).size_;
  auVar5 = (uchar  [8])(service->content).disposer;
  (service->content).ptr = (char *)0x0;
  (service->content).size_ = 0;
  local_a8._16_8_ = (Disposer *)0x0;
  pAStack_90 = (AsyncInputStream *)0x0;
  local_80._0_4_ = 0;
  local_80[4] = false;
  local_80._5_3_ = 0;
  local_80._8_8_ = 0;
  local_88 = pLVar2;
  local_80._16_8_ = auVar5;
  f.exception = (Exception *)CONCAT44(portHint,fds[1]);
  local_60.host.content.ptr = (char *)pPVar1;
  local_60.host.content.size_ = (size_t)pDVar8;
  local_60.host.content.disposer = (ArrayDisposer *)pLVar2;
  local_60.service.content.ptr = (char *)pp_Var3;
  local_60.service.content.size_ = (size_t)pDVar4;
  local_60.service.content.disposer = (ArrayDisposer *)auVar5;
  this_00 = (Thread *)operator_new(0x18);
  local_f0.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>_>
                  *)operator_new(0x40);
  ((local_f0.ptr)->super_AttachmentPromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_operator___00432988;
  ((local_f0.ptr)->super_AttachmentPromiseNodeBase).dependency.disposer =
       (Disposer *)CONCAT44(portHint,fds[1]);
  ((local_f0.ptr)->super_AttachmentPromiseNodeBase).dependency.ptr = pPVar1;
  ((local_f0.ptr)->attachment).disposer = pDVar8;
  ((local_f0.ptr)->attachment).ptr = pLVar2;
  local_60.host.content.ptr = (char *)0x0;
  local_60.host.content.size_ = 0;
  local_f0.ptr[1].super_AttachmentPromiseNodeBase.super_PromiseNode._vptr_PromiseNode = pp_Var3;
  local_f0.ptr[1].super_AttachmentPromiseNodeBase.dependency.disposer = pDVar4;
  local_f0.ptr[1].super_AttachmentPromiseNodeBase.dependency.ptr = (PromiseNode *)auVar5;
  local_60.service.content.ptr = (char *)0x0;
  local_60.service.content.size_ = 0;
  __nbytes = &_::
              HeapDisposer<kj::Function<void()>::Impl<kj::CaptureByMove<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::$_1,kj::(anonymous_namespace)::SocketAddress::LookupParams>>>
              ::instance;
  local_f0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::CaptureByMove<kj::(anonymous_namespace)::SocketAddress::lookupHost(kj::LowLevelAsyncIoProvider&,kj::String,kj::String,unsigned_int,kj::_::NetworkFilter&)::$_1,kj::(anonymous_namespace)::SocketAddress::LookupParams>>>
        ::instance;
  Thread::Thread(this_00,(Function<void_()> *)&local_f0);
  Own<kj::Function<void_()>::Iface>::dispose((Own<kj::Function<void_()>::Iface> *)&local_f0);
  LookupParams::~LookupParams(&local_60);
  pDVar8 = (Disposer *)operator_new(0x100);
  pAVar6 = input.ptr;
  pDVar8->_vptr_Disposer = (_func_int **)&_::HeapDisposer<kj::Thread>::instance;
  input.ptr = (AsyncInputStream *)0x0;
  pDVar8[1]._vptr_Disposer = (_func_int **)this_00;
  pDVar8[2]._vptr_Disposer = (_func_int **)input.disposer;
  pDVar8[3]._vptr_Disposer = (_func_int **)pAVar6;
  pDVar8[4]._vptr_Disposer = (_func_int **)filter;
  *(undefined4 *)&pDVar8[0x1b]._vptr_Disposer = 0;
  pDVar8[0x1c]._vptr_Disposer = (_func_int **)0x0;
  memset(pDVar8 + 5,0,0xa0);
  pDVar8[0x1d]._vptr_Disposer = (_func_int **)(pDVar8 + 0x1b);
  pDVar8[0x1e]._vptr_Disposer = (_func_int **)(pDVar8 + 0x1b);
  pDVar8[0x1f]._vptr_Disposer = (_func_int **)0x0;
  LookupReader::read((LookupReader *)local_a8,(int)pDVar8,__buf,(size_t)__nbytes);
  this_01 = (AttachmentPromiseNodeBase *)operator_new(0x28);
  _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (this_01,(Own<kj::_::PromiseNode> *)local_a8);
  (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00432ab0;
  this_01[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)
       &_::HeapDisposer<kj::(anonymous_namespace)::SocketAddress::LookupReader>::instance;
  this_01[1].dependency.disposer = pDVar8;
  local_f0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>>
        ::instance;
  f.exception = (Exception *)
                &_::
                 HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>>
                 ::instance;
  local_f0.ptr = (AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>_>
                  *)0x0;
  *(undefined8 **)this =
       &_::
        HeapDisposer<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>>>
        ::instance;
  *(AttachmentPromiseNodeBase **)&this->addr = this_01;
  local_60.host.content.ptr = (char *)0x0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::SocketAddress::LookupReader>_>_>
  ::~Own(&local_f0);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_a8);
  LookupParams::~LookupParams((LookupParams *)(local_a8 + 0x10));
  Own<kj::AsyncInputStream>::dispose(&input);
  PVar9.super_PromiseBase.node.ptr = extraout_RDX;
  PVar9.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>)PVar9.super_PromiseBase.node
  ;
}

Assistant:

Promise<Array<SocketAddress>> SocketAddress::lookupHost(
    LowLevelAsyncIoProvider& lowLevel, kj::String host, kj::String service, uint portHint,
    _::NetworkFilter& filter) {
  // This shitty function spawns a thread to run getaddrinfo().  Unfortunately, getaddrinfo() is
  // the only cross-platform DNS API and it is blocking.
  //
  // TODO(perf):  Use a thread pool?  Maybe kj::Thread should use a thread pool automatically?
  //   Maybe use the various platform-specific asynchronous DNS libraries?  Please do not implement
  //   a custom DNS resolver...

  int fds[2];
#if __linux__ && !__BIONIC__
  KJ_SYSCALL(pipe2(fds, O_NONBLOCK | O_CLOEXEC));
#else
  KJ_SYSCALL(pipe(fds));
#endif

  auto input = lowLevel.wrapInputFd(fds[0], NEW_FD_FLAGS);

  int outFd = fds[1];

  LookupParams params = { kj::mv(host), kj::mv(service) };

  auto thread = heap<Thread>(kj::mvCapture(params, [outFd,portHint](LookupParams&& params) {
    FdOutputStream output((AutoCloseFd(outFd)));

    struct addrinfo* list;
    int status = getaddrinfo(
        params.host == "*" ? nullptr : params.host.cStr(),
        params.service == nullptr ? nullptr : params.service.cStr(),
        nullptr, &list);
    if (status == 0) {
      KJ_DEFER(freeaddrinfo(list));

      struct addrinfo* cur = list;
      while (cur != nullptr) {
        if (params.service == nullptr) {
          switch (cur->ai_addr->sa_family) {
            case AF_INET:
              ((struct sockaddr_in*)cur->ai_addr)->sin_port = htons(portHint);
              break;
            case AF_INET6:
              ((struct sockaddr_in6*)cur->ai_addr)->sin6_port = htons(portHint);
              break;
            default:
              break;
          }
        }

        SocketAddress addr;
        if (params.host == "*") {
          // Set up a wildcard SocketAddress.  Only use the port number returned by getaddrinfo().
          addr.wildcard = true;
          addr.addrlen = sizeof(addr.addr.inet6);
          addr.addr.inet6.sin6_family = AF_INET6;
          switch (cur->ai_addr->sa_family) {
            case AF_INET:
              addr.addr.inet6.sin6_port = ((struct sockaddr_in*)cur->ai_addr)->sin_port;
              break;
            case AF_INET6:
              addr.addr.inet6.sin6_port = ((struct sockaddr_in6*)cur->ai_addr)->sin6_port;
              break;
            default:
              addr.addr.inet6.sin6_port = portHint;
              break;
          }
        } else {
          addr.addrlen = cur->ai_addrlen;
          memcpy(&addr.addr.generic, cur->ai_addr, cur->ai_addrlen);
        }
        KJ_ASSERT_CAN_MEMCPY(SocketAddress);
        output.write(&addr, sizeof(addr));
        cur = cur->ai_next;
      }
    } else if (status == EAI_SYSTEM) {
      KJ_FAIL_SYSCALL("getaddrinfo", errno, params.host, params.service) {
        return;
      }
    } else {
      KJ_FAIL_REQUIRE("DNS lookup failed.",
                      params.host, params.service, gai_strerror(status)) {
        return;
      }
    }
  }));

  auto reader = heap<LookupReader>(kj::mv(thread), kj::mv(input), filter);
  return reader->read().attach(kj::mv(reader));
}